

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O2

bool ChakraRTInterface::LoadChakraDll(ArgInfo *argInfo,HINSTANCE *outLibrary)

{
  DWORD DVar1;
  HINSTANCE hModule;
  PAL_FILE *stream;
  bool bVar2;
  char local_128 [8];
  char dllName [260];
  
  m_argInfo = argInfo;
  GetBinaryPathWithFileNameA(local_128,0x104,chakraDllName);
  hModule = LoadChakraCore(local_128);
  *outLibrary = hModule;
  if (hModule == (HINSTANCE)0x0) {
    DVar1 = GetLastError();
    bVar2 = false;
    stream = PAL_get_stderr(0);
    PAL_fwprintf(stream,L"FATAL ERROR: Unable to load %S GetLastError=0x%x\n",local_128,(ulong)DVar1
                );
  }
  else if (m_usageStringPrinted == true) {
    UnloadChakraDll(hModule);
    bVar2 = false;
  }
  else {
    m_jsApiHooks.pfJsrtCreateRuntime =
         (JsrtCreateRuntimePtr)GetProcAddress(hModule,"JsCreateRuntime");
    m_jsApiHooks.pfJsrtCreateContext =
         (JsrtCreateContextPtr)GetProcAddress(hModule,"JsCreateContext");
    m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback =
         (JsrtSetObjectBeforeCollectCallbackPtr)
         GetProcAddress(hModule,"JsSetObjectBeforeCollectCallback");
    m_jsApiHooks.pfJsrtSetRuntimeDomWrapperTracingCallbacks =
         (JsrtSetRuntimeDomWrapperTracingCallbacksPtr)
         GetProcAddress(hModule,"JsSetRuntimeDomWrapperTracingCallbacks");
    m_jsApiHooks.pfJsrtSetRuntimeMemoryLimit =
         (JsrtSetRuntimeMemoryLimitPtr)GetProcAddress(hModule,"JsSetRuntimeMemoryLimit");
    m_jsApiHooks.pfJsrtSetCurrentContext =
         (JsrtSetCurrentContextPtr)GetProcAddress(hModule,"JsSetCurrentContext");
    m_jsApiHooks.pfJsrtGetCurrentContext =
         (JsrtGetCurrentContextPtr)GetProcAddress(hModule,"JsGetCurrentContext");
    m_jsApiHooks.pfJsrtDisposeRuntime =
         (JsrtDisposeRuntimePtr)GetProcAddress(hModule,"JsDisposeRuntime");
    m_jsApiHooks.pfJsrtCreateObject = (JsrtCreateObjectPtr)GetProcAddress(hModule,"JsCreateObject");
    m_jsApiHooks.pfJsrtCreateExternalObject =
         (JsrtCreateExternalObjectPtr)GetProcAddress(hModule,"JsCreateExternalObject");
    m_jsApiHooks.pfJsrtGetArrayForEachFunction =
         (JsrtGetArrayForEachFunctionPtr)GetProcAddress(hModule,"JsGetArrayForEachFunction");
    m_jsApiHooks.pfJsrtGetArrayKeysFunction =
         (JsrtGetArrayKeysFunctionPtr)GetProcAddress(hModule,"JsGetArrayKeysFunction");
    m_jsApiHooks.pfJsrtGetArrayValuesFunction =
         (JsrtGetArrayValuesFunctionPtr)GetProcAddress(hModule,"JsGetArrayValuesFunction");
    m_jsApiHooks.pfJsrtGetArrayEntriesFunction =
         (JsrtGetArrayEntriesFunctionPtr)GetProcAddress(hModule,"JsGetArrayEntriesFunction");
    m_jsApiHooks.pfJsrtGetPropertyIdSymbolIterator =
         (JsrtGetPropertyIdSymbolIteratorPtr)GetProcAddress(hModule,"JsGetPropertyIdSymbolIterator")
    ;
    m_jsApiHooks.pfJsrtGetErrorPrototype =
         (JsrtGetErrorPrototypePtr)GetProcAddress(hModule,"JsGetErrorPrototype");
    m_jsApiHooks.pfJsrtGetIteratorPrototype =
         (JsrtGetIteratorPrototypePtr)GetProcAddress(hModule,"JsGetIteratorPrototype");
    m_jsApiHooks.pfJsrtCreateFunction =
         (JsrtCreateFunctionPtr)GetProcAddress(hModule,"JsCreateFunction");
    m_jsApiHooks.pfJsrtCreateNamedFunction =
         (JsCreateNamedFunctionPtr)GetProcAddress(hModule,"JsCreateNamedFunction");
    m_jsApiHooks.pfJsrtSetProperty = (JsrtSetPropertyPtr)GetProcAddress(hModule,"JsSetProperty");
    m_jsApiHooks.pfJsrtGetGlobalObject =
         (JsrtGetGlobalObjectPtr)GetProcAddress(hModule,"JsGetGlobalObject");
    m_jsApiHooks.pfJsrtGetUndefinedValue =
         (JsrtGetUndefinedValuePtr)GetProcAddress(hModule,"JsGetUndefinedValue");
    m_jsApiHooks.pfJsrtGetNullValue =
         (JsrtGetUndefinedValuePtr)GetProcAddress(hModule,"JsGetNullValue");
    m_jsApiHooks.pfJsrtGetTrueValue =
         (JsrtGetUndefinedValuePtr)GetProcAddress(hModule,"JsGetTrueValue");
    m_jsApiHooks.pfJsrtGetFalseValue =
         (JsrtGetUndefinedValuePtr)GetProcAddress(hModule,"JsGetFalseValue");
    m_jsApiHooks.pfJsrtConvertValueToString =
         (JsrtConvertValueToStringPtr)GetProcAddress(hModule,"JsConvertValueToString");
    m_jsApiHooks.pfJsrtConvertValueToNumber =
         (JsrtConvertValueToNumberPtr)GetProcAddress(hModule,"JsConvertValueToNumber");
    m_jsApiHooks.pfJsrtConvertValueToBoolean =
         (JsrtConvertValueToBooleanPtr)GetProcAddress(hModule,"JsConvertValueToBoolean");
    m_jsApiHooks.pfJsrtBooleanToBool =
         (JsrtBooleanToBoolPtr)GetProcAddress(hModule,"JsBooleanToBool");
    m_jsApiHooks.pfJsrtGetProperty = (JsrtGetPropertyPtr)GetProcAddress(hModule,"JsGetProperty");
    m_jsApiHooks.pfJsrtHasProperty = (JsrtHasPropertyPtr)GetProcAddress(hModule,"JsHasProperty");
    m_jsApiHooks.pfJsrtCallFunction = (JsrtCallFunctionPtr)GetProcAddress(hModule,"JsCallFunction");
    m_jsApiHooks.pfJsrtNumberToDouble =
         (JsrtNumberToDoublePtr)GetProcAddress(hModule,"JsNumberToDouble");
    m_jsApiHooks.pfJsrtNumberToInt = (JsrtNumberToIntPtr)GetProcAddress(hModule,"JsNumberToInt");
    m_jsApiHooks.pfJsrtIntToNumber = (JsrtIntToNumberPtr)GetProcAddress(hModule,"JsIntToNumber");
    m_jsApiHooks.pfJsrtDoubleToNumber =
         (JsrtDoubleToNumberPtr)GetProcAddress(hModule,"JsDoubleToNumber");
    m_jsApiHooks.pfJsrtGetExternalData =
         (JsrtGetExternalDataPtr)GetProcAddress(hModule,"JsGetExternalData");
    m_jsApiHooks.pfJsrtSetExternalData =
         (JsrtSetExternalDataPtr)GetProcAddress(hModule,"JsSetExternalData");
    m_jsApiHooks.pfJsrtCloneObject = (JsrtCloneObjectPtr)GetProcAddress(hModule,"JsCloneObject");
    m_jsApiHooks.pfJsrtCreateArray = (JsrtCreateArrayPtr)GetProcAddress(hModule,"JsCreateArray");
    m_jsApiHooks.pfJsrtCreateArrayBuffer =
         (JsrtCreateArrayBufferPtr)GetProcAddress(hModule,"JsCreateArrayBuffer");
    m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent =
         (JsrtCreateSharedArrayBufferWithSharedContentPtr)
         GetProcAddress(hModule,"JsCreateSharedArrayBufferWithSharedContent");
    m_jsApiHooks.pfJsrtGetSharedArrayBufferContent =
         (JsrtGetSharedArrayBufferContentPtr)GetProcAddress(hModule,"JsGetSharedArrayBufferContent")
    ;
    m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle =
         (JsrtReleaseSharedArrayBufferContentHandlePtr)
         GetProcAddress(hModule,"JsReleaseSharedArrayBufferContentHandle");
    m_jsApiHooks.pfJsrtGetArrayBufferStorage =
         (JsrtGetArrayBufferStoragePtr)GetProcAddress(hModule,"JsGetArrayBufferStorage");
    m_jsApiHooks.pfJsrtHasException = (JsrtHasExceptionPtr)GetProcAddress(hModule,"JsHasException");
    m_jsApiHooks.pfJsrtSetException = (JsrtSetExceptionPtr)GetProcAddress(hModule,"JsSetException");
    m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata =
         (JsrtGetAndClearExceptiopnWithMetadataPtr)
         GetProcAddress(hModule,"JsGetAndClearExceptionWithMetadata");
    m_jsApiHooks.pfJsrtGetAndClearException =
         (JsrtGetAndClearExceptiopnPtr)GetProcAddress(hModule,"JsGetAndClearException");
    m_jsApiHooks.pfJsrtCreateError = (JsrtCreateErrorPtr)GetProcAddress(hModule,"JsCreateError");
    m_jsApiHooks.pfJsrtGetRuntime = (JsrtGetRuntimePtr)GetProcAddress(hModule,"JsGetRuntime");
    m_jsApiHooks.pfJsrtRelease = (JsrtReleasePtr)GetProcAddress(hModule,"JsRelease");
    m_jsApiHooks.pfJsrtAddRef = (JsrtAddRefPtr)GetProcAddress(hModule,"JsAddRef");
    m_jsApiHooks.pfJsrtGetValueType = (JsrtGetValueType)GetProcAddress(hModule,"JsGetValueType");
    m_jsApiHooks.pfJsrtGetIndexedProperty =
         (JsrtGetIndexedPropertyPtr)GetProcAddress(hModule,"JsGetIndexedProperty");
    m_jsApiHooks.pfJsrtSetIndexedProperty =
         (JsrtSetIndexedPropertyPtr)GetProcAddress(hModule,"JsSetIndexedProperty");
    m_jsApiHooks.pfJsrtSetPromiseContinuationCallback =
         (JsrtSetPromiseContinuationCallbackPtr)
         GetProcAddress(hModule,"JsSetPromiseContinuationCallback");
    m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker =
         (JsrtSetHostPromiseRejectionTrackerPtr)
         GetProcAddress(hModule,"JsSetHostPromiseRejectionTracker");
    m_jsApiHooks.pfJsrtGetContextOfObject =
         (JsrtGetContextOfObject)GetProcAddress(hModule,"JsGetContextOfObject");
    m_jsApiHooks.pfJsrtInitializeModuleRecord =
         (JsInitializeModuleRecordPtr)GetProcAddress(hModule,"JsInitializeModuleRecord");
    m_jsApiHooks.pfJsrtParseModuleSource =
         (JsParseModuleSourcePtr)GetProcAddress(hModule,"JsParseModuleSource");
    m_jsApiHooks.pfJsrtSetModuleHostInfo =
         (JsSetModuleHostInfoPtr)GetProcAddress(hModule,"JsSetModuleHostInfo");
    m_jsApiHooks.pfJsrtGetModuleHostInfo =
         (JsGetModuleHostInfoPtr)GetProcAddress(hModule,"JsGetModuleHostInfo");
    m_jsApiHooks.pfJsrtModuleEvaluation =
         (JsModuleEvaluationPtr)GetProcAddress(hModule,"JsModuleEvaluation");
    m_jsApiHooks.pfJsrtGetModuleNamespace =
         (JsGetModuleNamespacePtr)GetProcAddress(hModule,"JsGetModuleNamespace");
    m_jsApiHooks.pfJsrtDiagStartDebugging =
         (JsrtDiagStartDebugging)GetProcAddress(hModule,"JsDiagStartDebugging");
    m_jsApiHooks.pfJsrtDiagStopDebugging =
         (JsrtDiagStopDebugging)GetProcAddress(hModule,"JsDiagStopDebugging");
    m_jsApiHooks.pfJsrtDiagGetSource = (JsrtDiagGetSource)GetProcAddress(hModule,"JsDiagGetSource");
    m_jsApiHooks.pfJsrtDiagSetBreakpoint =
         (JsrtDiagSetBreakpoint)GetProcAddress(hModule,"JsDiagSetBreakpoint");
    m_jsApiHooks.pfJsrtDiagGetStackTrace =
         (JsrtDiagGetStackTrace)GetProcAddress(hModule,"JsDiagGetStackTrace");
    m_jsApiHooks.pfJsrtDiagRequestAsyncBreak =
         (JsrtDiagRequestAsyncBreak)GetProcAddress(hModule,"JsDiagRequestAsyncBreak");
    m_jsApiHooks.pfJsrtDiagGetBreakpoints =
         (JsrtDiagGetBreakpoints)GetProcAddress(hModule,"JsDiagGetBreakpoints");
    m_jsApiHooks.pfJsrtDiagRemoveBreakpoint =
         (JsrtDiagRemoveBreakpoint)GetProcAddress(hModule,"JsDiagRemoveBreakpoint");
    m_jsApiHooks.pfJsrtDiagSetBreakOnException =
         (JsrtDiagSetBreakOnException)GetProcAddress(hModule,"JsDiagSetBreakOnException");
    m_jsApiHooks.pfJsrtDiagGetBreakOnException =
         (JsrtDiagGetBreakOnException)GetProcAddress(hModule,"JsDiagGetBreakOnException");
    m_jsApiHooks.pfJsrtDiagSetStepType =
         (JsrtDiagSetStepType)GetProcAddress(hModule,"JsDiagSetStepType");
    m_jsApiHooks.pfJsrtDiagGetScripts =
         (JsrtDiagGetScripts)GetProcAddress(hModule,"JsDiagGetScripts");
    m_jsApiHooks.pfJsrtDiagGetFunctionPosition =
         (JsrtDiagGetFunctionPosition)GetProcAddress(hModule,"JsDiagGetFunctionPosition");
    m_jsApiHooks.pfJsrtDiagGetStackProperties =
         (JsrtDiagGetStackProperties)GetProcAddress(hModule,"JsDiagGetStackProperties");
    m_jsApiHooks.pfJsrtDiagGetProperties =
         (JsrtDiagGetProperties)GetProcAddress(hModule,"JsDiagGetProperties");
    m_jsApiHooks.pfJsrtDiagGetObjectFromHandle =
         (JsrtDiagGetObjectFromHandle)GetProcAddress(hModule,"JsDiagGetObjectFromHandle");
    m_jsApiHooks.pfJsrtDiagEvaluate = (JsrtDiagEvaluate)GetProcAddress(hModule,"JsDiagEvaluate");
    m_jsApiHooks.pfJsrtRun = (JsrtRun)GetProcAddress(hModule,"JsRun");
    m_jsApiHooks.pfJsrtParse = (JsrtParse)GetProcAddress(hModule,"JsParse");
    m_jsApiHooks.pfJsrtSerialize = (JsrtSerialize)GetProcAddress(hModule,"JsSerialize");
    m_jsApiHooks.pfJsrtRunSerialized = (JsrtRunSerialized)GetProcAddress(hModule,"JsRunSerialized");
    m_jsApiHooks.pfJsrtGetStringLength =
         (JsrtGetStringLength)GetProcAddress(hModule,"JsGetStringLength");
    m_jsApiHooks.pfJsrtCreateString = (JsrtCreateString)GetProcAddress(hModule,"JsCreateString");
    m_jsApiHooks.pfJsrtCreateStringUtf16 =
         (JsrtCreateStringUtf16)GetProcAddress(hModule,"JsCreateStringUtf16");
    m_jsApiHooks.pfJsrtCopyString = (JsrtCopyString)GetProcAddress(hModule,"JsCopyString");
    m_jsApiHooks.pfJsrtCreatePropertyId =
         (JsrtCreatePropertyId)GetProcAddress(hModule,"JsCreatePropertyId");
    m_jsApiHooks.pfJsrtCreateExternalArrayBuffer =
         (JsrtCreateExternalArrayBuffer)GetProcAddress(hModule,"JsCreateExternalArrayBuffer");
    m_jsApiHooks.pfJsrtGetProxyProperties =
         (JsrtGetProxyProperties)GetProcAddress(hModule,"JsGetProxyProperties");
    m_jsApiHooks.pfJsrtSerializeParserState =
         (JsrtSerializeParserState)GetProcAddress(hModule,"JsSerializeParserState");
    m_jsApiHooks.pfJsrtRunScriptWithParserState =
         (JsrtRunScriptWithParserState)GetProcAddress(hModule,"JsRunScriptWithParserState");
    m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental =
         (JsrtQueueBackgroundParse_Experimental)
         GetProcAddress(hModule,"JsQueueBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtDiscardBackgroundParse_Experimental =
         (JsrtDiscardBackgroundParse_Experimental)
         GetProcAddress(hModule,"JsDiscardBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental =
         (JsrtExecuteBackgroundParse_Experimental)
         GetProcAddress(hModule,"JsExecuteBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtTTDCreateRecordRuntime =
         (JsrtTTDCreateRecordRuntimePtr)GetProcAddress(hModule,"JsTTDCreateRecordRuntime");
    m_jsApiHooks.pfJsrtTTDCreateReplayRuntime =
         (JsrtTTDCreateReplayRuntimePtr)GetProcAddress(hModule,"JsTTDCreateReplayRuntime");
    m_jsApiHooks.pfJsrtTTDCreateContext =
         (JsrtTTDCreateContextPtr)GetProcAddress(hModule,"JsTTDCreateContext");
    m_jsApiHooks.pfJsrtTTDNotifyContextDestroy =
         (JsrtTTDNotifyContextDestroyPtr)GetProcAddress(hModule,"JsTTDNotifyContextDestroy");
    m_jsApiHooks.pfJsrtTTDStart = (JsrtTTDStartPtr)GetProcAddress(hModule,"JsTTDStart");
    m_jsApiHooks.pfJsrtTTDStop = (JsrtTTDStopPtr)GetProcAddress(hModule,"JsTTDStop");
    m_jsApiHooks.pfJsrtTTDNotifyYield =
         (JsrtTTDNotifyYieldPtr)GetProcAddress(hModule,"JsTTDNotifyYield");
    m_jsApiHooks.pfJsrtTTDHostExit = (JsrtTTDHostExitPtr)GetProcAddress(hModule,"JsTTDHostExit");
    m_jsApiHooks.pfJsrtTTDGetSnapTimeTopLevelEventMove =
         (JsrtTTDGetSnapTimeTopLevelEventMovePtr)
         GetProcAddress(hModule,"JsTTDGetSnapTimeTopLevelEventMove");
    m_jsApiHooks.pfJsrtTTDMoveToTopLevelEvent =
         (JsrtTTDMoveToTopLevelEventPtr)GetProcAddress(hModule,"JsTTDMoveToTopLevelEvent");
    m_jsApiHooks.pfJsrtTTDReplayExecution =
         (JsrtTTDReplayExecutionPtr)GetProcAddress(hModule,"JsTTDReplayExecution");
    m_jsApiHooks.pfJsrtVarSerializer =
         (JsrtVarSerializerPtr)GetProcAddress(hModule,"JsVarSerializer");
    m_jsApiHooks.pfJsrtVarSerializerSetTransferableVars =
         (JsrtVarSerializerSetTransferableVarsPtr)
         GetProcAddress(hModule,"JsVarSerializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarSerializerWriteValue =
         (JsrtVarSerializerWriteValuePtr)GetProcAddress(hModule,"JsVarSerializerWriteValue");
    m_jsApiHooks.pfJsrtVarSerializerReleaseData =
         (JsrtVarSerializerReleaseDataPtr)GetProcAddress(hModule,"JsVarSerializerReleaseData");
    m_jsApiHooks.pfJsrtVarSerializerFree =
         (JsrtVarSerializerFreePtr)GetProcAddress(hModule,"JsVarSerializerFree");
    m_jsApiHooks.pfJsrtVarDeserializer =
         (JsrtVarDeserializerPtr)GetProcAddress(hModule,"JsVarDeserializer");
    m_jsApiHooks.pfJsrtVarDeserializerSetTransferableVars =
         (JsrtVarDeserializerSetTransferableVarsPtr)
         GetProcAddress(hModule,"JsVarDeserializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarDeserializerReadValue =
         (JsrtVarDeserializerReadValuePtr)GetProcAddress(hModule,"JsVarDeserializerReadValue");
    m_jsApiHooks.pfJsrtVarDeserializerFree =
         (JsrtVarDeserializerFreePtr)GetProcAddress(hModule,"JsVarDeserializerFree");
    m_jsApiHooks.pfJsrtDetachArrayBuffer =
         (JsrtDetachArrayBufferPtr)GetProcAddress(hModule,"JsDetachArrayBuffer");
    m_jsApiHooks.pfJsrtGetArrayBufferFreeFunction =
         (JsrtGetArrayBufferFreeFunction)GetProcAddress(hModule,"JsGetArrayBufferFreeFunction");
    m_jsApiHooks.pfJsrtExternalizeArrayBuffer =
         (JsrtExternalizeArrayBufferPtr)GetProcAddress(hModule,"JsExternalizeArrayBuffer");
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool ChakraRTInterface::LoadChakraDll(ArgInfo* argInfo, HINSTANCE *outLibrary)
{
    m_argInfo = argInfo;
#ifndef CHAKRA_STATIC_LIBRARY
    HINSTANCE library = nullptr;

    char dllName[_MAX_PATH];
    GetBinaryPathWithFileNameA(dllName, _MAX_PATH, chakraDllName);

    library = LoadChakraCore(dllName);
    *outLibrary = library;
    if (library == nullptr)
    {
        int ret = GetLastError();
        fwprintf(stderr, _u("FATAL ERROR: Unable to load %S GetLastError=0x%x\n"), dllName, ret);
        return false;
    }

    if (m_usageStringPrinted)
    {
        UnloadChakraDll(library);
        return false;
    }

    m_jsApiHooks.pfJsrtCreateRuntime = (JsAPIHooks::JsrtCreateRuntimePtr)GetChakraCoreSymbol(library, "JsCreateRuntime");
    m_jsApiHooks.pfJsrtCreateContext = (JsAPIHooks::JsrtCreateContextPtr)GetChakraCoreSymbol(library, "JsCreateContext");
    m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback = (JsAPIHooks::JsrtSetObjectBeforeCollectCallbackPtr)GetChakraCoreSymbol(library, "JsSetObjectBeforeCollectCallback");
    m_jsApiHooks.pfJsrtSetRuntimeDomWrapperTracingCallbacks = (JsAPIHooks::JsrtSetRuntimeDomWrapperTracingCallbacksPtr)GetChakraCoreSymbol(library, "JsSetRuntimeDomWrapperTracingCallbacks");
    m_jsApiHooks.pfJsrtSetRuntimeMemoryLimit = (JsAPIHooks::JsrtSetRuntimeMemoryLimitPtr)GetChakraCoreSymbol(library, "JsSetRuntimeMemoryLimit");
    m_jsApiHooks.pfJsrtSetCurrentContext = (JsAPIHooks::JsrtSetCurrentContextPtr)GetChakraCoreSymbol(library, "JsSetCurrentContext");
    m_jsApiHooks.pfJsrtGetCurrentContext = (JsAPIHooks::JsrtGetCurrentContextPtr)GetChakraCoreSymbol(library, "JsGetCurrentContext");
    m_jsApiHooks.pfJsrtDisposeRuntime = (JsAPIHooks::JsrtDisposeRuntimePtr)GetChakraCoreSymbol(library, "JsDisposeRuntime");
    m_jsApiHooks.pfJsrtCreateObject = (JsAPIHooks::JsrtCreateObjectPtr)GetChakraCoreSymbol(library, "JsCreateObject");
    m_jsApiHooks.pfJsrtCreateExternalObject = (JsAPIHooks::JsrtCreateExternalObjectPtr)GetChakraCoreSymbol(library, "JsCreateExternalObject");
    m_jsApiHooks.pfJsrtGetArrayForEachFunction = (JsAPIHooks::JsrtGetArrayForEachFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayForEachFunction");;
    m_jsApiHooks.pfJsrtGetArrayKeysFunction = (JsAPIHooks::JsrtGetArrayKeysFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayKeysFunction");;
    m_jsApiHooks.pfJsrtGetArrayValuesFunction = (JsAPIHooks::JsrtGetArrayValuesFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayValuesFunction");;
    m_jsApiHooks.pfJsrtGetArrayEntriesFunction = (JsAPIHooks::JsrtGetArrayEntriesFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayEntriesFunction");;
    m_jsApiHooks.pfJsrtGetPropertyIdSymbolIterator = (JsAPIHooks::JsrtGetPropertyIdSymbolIteratorPtr)GetChakraCoreSymbol(library, "JsGetPropertyIdSymbolIterator");;
    m_jsApiHooks.pfJsrtGetErrorPrototype = (JsAPIHooks::JsrtGetErrorPrototypePtr)GetChakraCoreSymbol(library, "JsGetErrorPrototype");;
    m_jsApiHooks.pfJsrtGetIteratorPrototype = (JsAPIHooks::JsrtGetIteratorPrototypePtr)GetChakraCoreSymbol(library, "JsGetIteratorPrototype");;
    m_jsApiHooks.pfJsrtCreateFunction = (JsAPIHooks::JsrtCreateFunctionPtr)GetChakraCoreSymbol(library, "JsCreateFunction");
    m_jsApiHooks.pfJsrtCreateNamedFunction = (JsAPIHooks::JsCreateNamedFunctionPtr)GetChakraCoreSymbol(library, "JsCreateNamedFunction");
    m_jsApiHooks.pfJsrtSetProperty = (JsAPIHooks::JsrtSetPropertyPtr)GetChakraCoreSymbol(library, "JsSetProperty");
    m_jsApiHooks.pfJsrtGetGlobalObject = (JsAPIHooks::JsrtGetGlobalObjectPtr)GetChakraCoreSymbol(library, "JsGetGlobalObject");
    m_jsApiHooks.pfJsrtGetUndefinedValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetUndefinedValue");
    m_jsApiHooks.pfJsrtGetNullValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetNullValue");
    m_jsApiHooks.pfJsrtGetTrueValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetTrueValue");
    m_jsApiHooks.pfJsrtGetFalseValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetFalseValue");
    m_jsApiHooks.pfJsrtConvertValueToString = (JsAPIHooks::JsrtConvertValueToStringPtr)GetChakraCoreSymbol(library, "JsConvertValueToString");
    m_jsApiHooks.pfJsrtConvertValueToNumber = (JsAPIHooks::JsrtConvertValueToNumberPtr)GetChakraCoreSymbol(library, "JsConvertValueToNumber");
    m_jsApiHooks.pfJsrtConvertValueToBoolean = (JsAPIHooks::JsrtConvertValueToBooleanPtr)GetChakraCoreSymbol(library, "JsConvertValueToBoolean");
    m_jsApiHooks.pfJsrtBooleanToBool = (JsAPIHooks::JsrtBooleanToBoolPtr)GetChakraCoreSymbol(library, "JsBooleanToBool");
    m_jsApiHooks.pfJsrtGetProperty = (JsAPIHooks::JsrtGetPropertyPtr)GetChakraCoreSymbol(library, "JsGetProperty");
    m_jsApiHooks.pfJsrtHasProperty = (JsAPIHooks::JsrtHasPropertyPtr)GetChakraCoreSymbol(library, "JsHasProperty");
    m_jsApiHooks.pfJsrtCallFunction = (JsAPIHooks::JsrtCallFunctionPtr)GetChakraCoreSymbol(library, "JsCallFunction");
    m_jsApiHooks.pfJsrtNumberToDouble = (JsAPIHooks::JsrtNumberToDoublePtr)GetChakraCoreSymbol(library, "JsNumberToDouble");
    m_jsApiHooks.pfJsrtNumberToInt = (JsAPIHooks::JsrtNumberToIntPtr)GetChakraCoreSymbol(library, "JsNumberToInt");
    m_jsApiHooks.pfJsrtIntToNumber = (JsAPIHooks::JsrtIntToNumberPtr)GetChakraCoreSymbol(library, "JsIntToNumber");
    m_jsApiHooks.pfJsrtDoubleToNumber = (JsAPIHooks::JsrtDoubleToNumberPtr)GetChakraCoreSymbol(library, "JsDoubleToNumber");
    m_jsApiHooks.pfJsrtGetExternalData = (JsAPIHooks::JsrtGetExternalDataPtr)GetChakraCoreSymbol(library, "JsGetExternalData");
    m_jsApiHooks.pfJsrtSetExternalData = (JsAPIHooks::JsrtSetExternalDataPtr)GetChakraCoreSymbol(library, "JsSetExternalData");
    m_jsApiHooks.pfJsrtCloneObject = (JsAPIHooks::JsrtCloneObjectPtr)GetChakraCoreSymbol(library, "JsCloneObject");
    m_jsApiHooks.pfJsrtCreateArray = (JsAPIHooks::JsrtCreateArrayPtr)GetChakraCoreSymbol(library, "JsCreateArray");
    m_jsApiHooks.pfJsrtCreateArrayBuffer = (JsAPIHooks::JsrtCreateArrayBufferPtr)GetChakraCoreSymbol(library, "JsCreateArrayBuffer");
    m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent = (JsAPIHooks::JsrtCreateSharedArrayBufferWithSharedContentPtr)GetChakraCoreSymbol(library, "JsCreateSharedArrayBufferWithSharedContent");
    m_jsApiHooks.pfJsrtGetSharedArrayBufferContent = (JsAPIHooks::JsrtGetSharedArrayBufferContentPtr)GetChakraCoreSymbol(library, "JsGetSharedArrayBufferContent");
    m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle = (JsAPIHooks::JsrtReleaseSharedArrayBufferContentHandlePtr)GetChakraCoreSymbol(library, "JsReleaseSharedArrayBufferContentHandle");
    m_jsApiHooks.pfJsrtGetArrayBufferStorage = (JsAPIHooks::JsrtGetArrayBufferStoragePtr)GetChakraCoreSymbol(library, "JsGetArrayBufferStorage");
    m_jsApiHooks.pfJsrtHasException = (JsAPIHooks::JsrtHasExceptionPtr)GetChakraCoreSymbol(library, "JsHasException");
    m_jsApiHooks.pfJsrtSetException = (JsAPIHooks::JsrtSetExceptionPtr)GetChakraCoreSymbol(library, "JsSetException");
    m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata = (JsAPIHooks::JsrtGetAndClearExceptiopnWithMetadataPtr)GetChakraCoreSymbol(library, "JsGetAndClearExceptionWithMetadata");
    m_jsApiHooks.pfJsrtGetAndClearException = (JsAPIHooks::JsrtGetAndClearExceptiopnPtr)GetChakraCoreSymbol(library, "JsGetAndClearException");
    m_jsApiHooks.pfJsrtCreateError = (JsAPIHooks::JsrtCreateErrorPtr)GetChakraCoreSymbol(library, "JsCreateError");
    m_jsApiHooks.pfJsrtGetRuntime = (JsAPIHooks::JsrtGetRuntimePtr)GetChakraCoreSymbol(library, "JsGetRuntime");
    m_jsApiHooks.pfJsrtRelease = (JsAPIHooks::JsrtReleasePtr)GetChakraCoreSymbol(library, "JsRelease");
    m_jsApiHooks.pfJsrtAddRef = (JsAPIHooks::JsrtAddRefPtr)GetChakraCoreSymbol(library, "JsAddRef");
    m_jsApiHooks.pfJsrtGetValueType = (JsAPIHooks::JsrtGetValueType)GetChakraCoreSymbol(library, "JsGetValueType");
    m_jsApiHooks.pfJsrtGetIndexedProperty = (JsAPIHooks::JsrtGetIndexedPropertyPtr)GetChakraCoreSymbol(library, "JsGetIndexedProperty");
    m_jsApiHooks.pfJsrtSetIndexedProperty = (JsAPIHooks::JsrtSetIndexedPropertyPtr)GetChakraCoreSymbol(library, "JsSetIndexedProperty");
    m_jsApiHooks.pfJsrtSetPromiseContinuationCallback = (JsAPIHooks::JsrtSetPromiseContinuationCallbackPtr)GetChakraCoreSymbol(library, "JsSetPromiseContinuationCallback");
    m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker = (JsAPIHooks::JsrtSetHostPromiseRejectionTrackerPtr)GetChakraCoreSymbol(library, "JsSetHostPromiseRejectionTracker");
    m_jsApiHooks.pfJsrtGetContextOfObject = (JsAPIHooks::JsrtGetContextOfObject)GetChakraCoreSymbol(library, "JsGetContextOfObject");
    m_jsApiHooks.pfJsrtInitializeModuleRecord = (JsAPIHooks::JsInitializeModuleRecordPtr)GetChakraCoreSymbol(library, "JsInitializeModuleRecord");
    m_jsApiHooks.pfJsrtParseModuleSource = (JsAPIHooks::JsParseModuleSourcePtr)GetChakraCoreSymbol(library, "JsParseModuleSource");
    m_jsApiHooks.pfJsrtSetModuleHostInfo = (JsAPIHooks::JsSetModuleHostInfoPtr)GetChakraCoreSymbol(library, "JsSetModuleHostInfo");
    m_jsApiHooks.pfJsrtGetModuleHostInfo = (JsAPIHooks::JsGetModuleHostInfoPtr)GetChakraCoreSymbol(library, "JsGetModuleHostInfo");
    m_jsApiHooks.pfJsrtModuleEvaluation = (JsAPIHooks::JsModuleEvaluationPtr)GetChakraCoreSymbol(library, "JsModuleEvaluation");
    m_jsApiHooks.pfJsrtGetModuleNamespace = (JsAPIHooks::JsGetModuleNamespacePtr)GetChakraCoreSymbol(library, "JsGetModuleNamespace");
    m_jsApiHooks.pfJsrtDiagStartDebugging = (JsAPIHooks::JsrtDiagStartDebugging)GetChakraCoreSymbol(library, "JsDiagStartDebugging");
    m_jsApiHooks.pfJsrtDiagStopDebugging = (JsAPIHooks::JsrtDiagStopDebugging)GetChakraCoreSymbol(library, "JsDiagStopDebugging");
    m_jsApiHooks.pfJsrtDiagGetSource = (JsAPIHooks::JsrtDiagGetSource)GetChakraCoreSymbol(library, "JsDiagGetSource");
    m_jsApiHooks.pfJsrtDiagSetBreakpoint = (JsAPIHooks::JsrtDiagSetBreakpoint)GetChakraCoreSymbol(library, "JsDiagSetBreakpoint");
    m_jsApiHooks.pfJsrtDiagGetStackTrace = (JsAPIHooks::JsrtDiagGetStackTrace)GetChakraCoreSymbol(library, "JsDiagGetStackTrace");
    m_jsApiHooks.pfJsrtDiagRequestAsyncBreak = (JsAPIHooks::JsrtDiagRequestAsyncBreak)GetChakraCoreSymbol(library, "JsDiagRequestAsyncBreak");
    m_jsApiHooks.pfJsrtDiagGetBreakpoints = (JsAPIHooks::JsrtDiagGetBreakpoints)GetChakraCoreSymbol(library, "JsDiagGetBreakpoints");
    m_jsApiHooks.pfJsrtDiagRemoveBreakpoint = (JsAPIHooks::JsrtDiagRemoveBreakpoint)GetChakraCoreSymbol(library, "JsDiagRemoveBreakpoint");
    m_jsApiHooks.pfJsrtDiagSetBreakOnException = (JsAPIHooks::JsrtDiagSetBreakOnException)GetChakraCoreSymbol(library, "JsDiagSetBreakOnException");
    m_jsApiHooks.pfJsrtDiagGetBreakOnException = (JsAPIHooks::JsrtDiagGetBreakOnException)GetChakraCoreSymbol(library, "JsDiagGetBreakOnException");
    m_jsApiHooks.pfJsrtDiagSetStepType = (JsAPIHooks::JsrtDiagSetStepType)GetChakraCoreSymbol(library, "JsDiagSetStepType");
    m_jsApiHooks.pfJsrtDiagGetScripts = (JsAPIHooks::JsrtDiagGetScripts)GetChakraCoreSymbol(library, "JsDiagGetScripts");
    m_jsApiHooks.pfJsrtDiagGetFunctionPosition = (JsAPIHooks::JsrtDiagGetFunctionPosition)GetChakraCoreSymbol(library, "JsDiagGetFunctionPosition");
    m_jsApiHooks.pfJsrtDiagGetStackProperties = (JsAPIHooks::JsrtDiagGetStackProperties)GetChakraCoreSymbol(library, "JsDiagGetStackProperties");
    m_jsApiHooks.pfJsrtDiagGetProperties = (JsAPIHooks::JsrtDiagGetProperties)GetChakraCoreSymbol(library, "JsDiagGetProperties");
    m_jsApiHooks.pfJsrtDiagGetObjectFromHandle = (JsAPIHooks::JsrtDiagGetObjectFromHandle)GetChakraCoreSymbol(library, "JsDiagGetObjectFromHandle");
    m_jsApiHooks.pfJsrtDiagEvaluate = (JsAPIHooks::JsrtDiagEvaluate)GetChakraCoreSymbol(library, "JsDiagEvaluate");
    m_jsApiHooks.pfJsrtRun = (JsAPIHooks::JsrtRun)GetChakraCoreSymbol(library, "JsRun");
    m_jsApiHooks.pfJsrtParse = (JsAPIHooks::JsrtParse)GetChakraCoreSymbol(library, "JsParse");
    m_jsApiHooks.pfJsrtSerialize = (JsAPIHooks::JsrtSerialize)GetChakraCoreSymbol(library, "JsSerialize");
    m_jsApiHooks.pfJsrtRunSerialized = (JsAPIHooks::JsrtRunSerialized)GetChakraCoreSymbol(library, "JsRunSerialized");
    m_jsApiHooks.pfJsrtGetStringLength = (JsAPIHooks::JsrtGetStringLength)GetChakraCoreSymbol(library, "JsGetStringLength");
    m_jsApiHooks.pfJsrtCreateString = (JsAPIHooks::JsrtCreateString)GetChakraCoreSymbol(library, "JsCreateString");
    m_jsApiHooks.pfJsrtCreateStringUtf16 = (JsAPIHooks::JsrtCreateStringUtf16)GetChakraCoreSymbol(library, "JsCreateStringUtf16");
    m_jsApiHooks.pfJsrtCopyString = (JsAPIHooks::JsrtCopyString)GetChakraCoreSymbol(library, "JsCopyString");
    m_jsApiHooks.pfJsrtCreatePropertyId = (JsAPIHooks::JsrtCreatePropertyId)GetChakraCoreSymbol(library, "JsCreatePropertyId");
    m_jsApiHooks.pfJsrtCreateExternalArrayBuffer = (JsAPIHooks::JsrtCreateExternalArrayBuffer)GetChakraCoreSymbol(library, "JsCreateExternalArrayBuffer");
    m_jsApiHooks.pfJsrtGetProxyProperties = (JsAPIHooks::JsrtGetProxyProperties)GetChakraCoreSymbol(library, "JsGetProxyProperties");
    m_jsApiHooks.pfJsrtSerializeParserState = (JsAPIHooks::JsrtSerializeParserState)GetChakraCoreSymbol(library, "JsSerializeParserState");
    m_jsApiHooks.pfJsrtRunScriptWithParserState = (JsAPIHooks::JsrtRunScriptWithParserState)GetChakraCoreSymbol(library, "JsRunScriptWithParserState");

    m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental = (JsAPIHooks::JsrtQueueBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsQueueBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtDiscardBackgroundParse_Experimental = (JsAPIHooks::JsrtDiscardBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsDiscardBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental = (JsAPIHooks::JsrtExecuteBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsExecuteBackgroundParse_Experimental");

    m_jsApiHooks.pfJsrtTTDCreateRecordRuntime = (JsAPIHooks::JsrtTTDCreateRecordRuntimePtr)GetChakraCoreSymbol(library, "JsTTDCreateRecordRuntime");
    m_jsApiHooks.pfJsrtTTDCreateReplayRuntime = (JsAPIHooks::JsrtTTDCreateReplayRuntimePtr)GetChakraCoreSymbol(library, "JsTTDCreateReplayRuntime");
    m_jsApiHooks.pfJsrtTTDCreateContext = (JsAPIHooks::JsrtTTDCreateContextPtr)GetChakraCoreSymbol(library, "JsTTDCreateContext");
    m_jsApiHooks.pfJsrtTTDNotifyContextDestroy = (JsAPIHooks::JsrtTTDNotifyContextDestroyPtr)GetChakraCoreSymbol(library, "JsTTDNotifyContextDestroy");

    m_jsApiHooks.pfJsrtTTDStart = (JsAPIHooks::JsrtTTDStartPtr)GetChakraCoreSymbol(library, "JsTTDStart");
    m_jsApiHooks.pfJsrtTTDStop = (JsAPIHooks::JsrtTTDStopPtr)GetChakraCoreSymbol(library, "JsTTDStop");

    m_jsApiHooks.pfJsrtTTDNotifyYield = (JsAPIHooks::JsrtTTDNotifyYieldPtr)GetChakraCoreSymbol(library, "JsTTDNotifyYield");
    m_jsApiHooks.pfJsrtTTDHostExit = (JsAPIHooks::JsrtTTDHostExitPtr)GetChakraCoreSymbol(library, "JsTTDHostExit");

    m_jsApiHooks.pfJsrtTTDGetSnapTimeTopLevelEventMove = (JsAPIHooks::JsrtTTDGetSnapTimeTopLevelEventMovePtr)GetChakraCoreSymbol(library, "JsTTDGetSnapTimeTopLevelEventMove");
    m_jsApiHooks.pfJsrtTTDMoveToTopLevelEvent = (JsAPIHooks::JsrtTTDMoveToTopLevelEventPtr)GetChakraCoreSymbol(library, "JsTTDMoveToTopLevelEvent");
    m_jsApiHooks.pfJsrtTTDReplayExecution = (JsAPIHooks::JsrtTTDReplayExecutionPtr)GetChakraCoreSymbol(library, "JsTTDReplayExecution");
    m_jsApiHooks.pfJsrtVarSerializer = (JsAPIHooks::JsrtVarSerializerPtr)GetChakraCoreSymbol(library, "JsVarSerializer");
    m_jsApiHooks.pfJsrtVarSerializerSetTransferableVars = (JsAPIHooks::JsrtVarSerializerSetTransferableVarsPtr)GetChakraCoreSymbol(library, "JsVarSerializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarSerializerWriteValue = (JsAPIHooks::JsrtVarSerializerWriteValuePtr)GetChakraCoreSymbol(library, "JsVarSerializerWriteValue");
    m_jsApiHooks.pfJsrtVarSerializerReleaseData = (JsAPIHooks::JsrtVarSerializerReleaseDataPtr)GetChakraCoreSymbol(library, "JsVarSerializerReleaseData");
    m_jsApiHooks.pfJsrtVarSerializerFree = (JsAPIHooks::JsrtVarSerializerFreePtr)GetChakraCoreSymbol(library, "JsVarSerializerFree");
    m_jsApiHooks.pfJsrtVarDeserializer = (JsAPIHooks::JsrtVarDeserializerPtr)GetChakraCoreSymbol(library, "JsVarDeserializer");
    m_jsApiHooks.pfJsrtVarDeserializerSetTransferableVars = (JsAPIHooks::JsrtVarDeserializerSetTransferableVarsPtr)GetChakraCoreSymbol(library, "JsVarDeserializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarDeserializerReadValue = (JsAPIHooks::JsrtVarDeserializerReadValuePtr)GetChakraCoreSymbol(library, "JsVarDeserializerReadValue");
    m_jsApiHooks.pfJsrtVarDeserializerFree = (JsAPIHooks::JsrtVarDeserializerFreePtr)GetChakraCoreSymbol(library, "JsVarDeserializerFree");

    m_jsApiHooks.pfJsrtDetachArrayBuffer = (JsAPIHooks::JsrtDetachArrayBufferPtr)GetChakraCoreSymbol(library, "JsDetachArrayBuffer");
    m_jsApiHooks.pfJsrtGetArrayBufferFreeFunction = (JsAPIHooks::JsrtGetArrayBufferFreeFunction)GetChakraCoreSymbol(library, "JsGetArrayBufferFreeFunction");
    m_jsApiHooks.pfJsrtExternalizeArrayBuffer = (JsAPIHooks::JsrtExternalizeArrayBufferPtr)GetChakraCoreSymbol(library, "JsExternalizeArrayBuffer");

#ifdef _WIN32
    m_jsApiHooks.pfJsrtConnectJITProcess = (JsAPIHooks::JsrtConnectJITProcess)GetChakraCoreSymbol(library, "JsConnectJITProcess");
#endif
#endif

    return true;
}